

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_group_bcast_scope(int scope,void *buf,int len,int root,ARMCI_Group *group)

{
  MPI_Comm poVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  ARMCI_Group *in_RSI;
  int in_EDI;
  MPI_Group group_sub;
  MPI_Group group_world;
  int err;
  int root_sub;
  MPI_Comm comm;
  ARMCI_Group *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_40;
  comex_group_t in_stack_ffffffffffffffc4;
  undefined8 local_38;
  int local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_18;
  undefined4 local_14;
  ARMCI_Group *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_EDI == 0x151) {
    if (_number_of_procs_per_node < 2) {
      MPI_Bcast(in_RSI,in_EDX,&ompi_mpi_byte,in_ECX,&ompi_mpi_comm_self);
    }
    else {
      local_18 = in_ECX;
      comex_group_comm(in_stack_ffffffffffffffc4,
                       (MPI_Comm *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      MPI_Bcast(local_10,local_14,&ompi_mpi_byte,local_18,local_28);
    }
  }
  else {
    poVar1 = wc();
    local_30 = MPI_Comm_group(poVar1,&local_38);
    if (local_30 != 0) {
      __assert_fail("MPI_SUCCESS == err",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x2e9,"void armci_msg_group_bcast_scope(int, void *, int, int, ARMCI_Group *)")
      ;
    }
    poVar1 = get_comm(in_stack_ffffffffffffffb0);
    local_30 = MPI_Comm_group(poVar1,&local_40);
    if (local_30 != 0) {
      __assert_fail("MPI_SUCCESS == err",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x2eb,"void armci_msg_group_bcast_scope(int, void *, int, int, ARMCI_Group *)")
      ;
    }
    local_30 = MPI_Group_translate_ranks
                         (local_38,1,&local_18,CONCAT44(in_stack_ffffffffffffffc4,local_40),
                          &local_2c);
    comex_barrier(scope);
    poVar1 = get_comm(local_10);
    local_30 = MPI_Bcast(local_10,local_14,&ompi_mpi_byte,local_2c,poVar1);
    if (local_30 != 0) {
      __assert_fail("MPI_SUCCESS == err",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x2f0,"void armci_msg_group_bcast_scope(int, void *, int, int, ARMCI_Group *)")
      ;
    }
  }
  return;
}

Assistant:

void armci_msg_group_bcast_scope(int scope, void *buf, int len, int root, ARMCI_Group *group)
{
    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node > 1) {
        MPI_Comm comm;
        comex_group_comm(ARMCI_Node_group, &comm);
        MPI_Bcast(buf, len, MPI_BYTE, root, comm);
      } else {
        MPI_Bcast(buf, len, MPI_BYTE, root, MPI_COMM_SELF);
      }
    }
    else {
        int root_sub;
        int err;
        /* NOTE: this function is passed a root which has been translated back
         * to the world group while the group passed in is the sub
         * communicator group... what a mess */
        MPI_Group group_world;
        MPI_Group group_sub;
        
        err = MPI_Comm_group(wc(), &group_world);
        assert(MPI_SUCCESS == err);
        err = MPI_Comm_group(get_comm(group), &group_sub);
        assert(MPI_SUCCESS == err);
        err = MPI_Group_translate_ranks(group_world, 1, &root,
                group_sub, &root_sub);
        comex_barrier(*group);
        err = MPI_Bcast(buf, len, MPI_BYTE, root_sub, get_comm(group));
        assert(MPI_SUCCESS == err);
    }
}